

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void ypr_text_squote_line(lys_ypr_ctx *pctx,char *text,int text_len)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  pcVar1 = text + text_len;
  iVar6 = (int)text;
  do {
    uVar5 = (long)pcVar1 - (long)text;
    if ((uVar5 == 0) || (pcVar2 = ly_strnchr(text,0x27,uVar5), pcVar2 == (char *)0x0)) {
      ly_print_((pctx->field_0).field_0.out,"%.*s",uVar5 & 0xffffffff,text);
      return;
    }
    uVar3 = 0;
    ly_print_((pctx->field_0).field_0.out,"%.*s",(ulong)(uint)((int)pcVar2 - (int)text),text);
    text = pcVar2;
    do {
      text = text + 1;
      uVar4 = (text_len + iVar6) - (int)pcVar2;
      if (text == pcVar1) break;
      uVar3 = uVar3 + 1;
      uVar4 = uVar3;
    } while (*text == '\'');
    uVar5 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar5 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"\' + \"%.*s\" +\n%*s\'",(ulong)uVar4,pcVar2,uVar5,"");
  } while( true );
}

Assistant:

static void
ypr_text_squote_line(struct lys_ypr_ctx *pctx, const char *text, int text_len)
{
    const char *end = text + text_len, *squote;
    int squote_len;

    while ((text != end) && (squote = ly_strnchr(text, '\'', end - text))) {
        /* before squote */
        ly_print_(pctx->out, "%.*s", (int)(squote - text), text);

        /* specially-encoded squote(s) */
        squote_len = 0;
        do {
            ++squote_len;
        } while ((squote + squote_len != end) && (squote[squote_len] == '\''));
        ly_print_(pctx->out, "' + \"%.*s\" +\n%*s'", squote_len, squote, INDENT);

        /* next iter */
        text = squote + squote_len;
    }

    ly_print_(pctx->out, "%.*s", (int)(end - text), text);
}